

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnCurveProjection.h
# Opt level: O0

ParameterPoint *
anurbs::PointOnCurveProjection<2L>::project_to_line
          (ParameterPoint *__return_storage_ptr__,Vector *point,Vector *a,Vector *b,double *t0,
          double *t1)

{
  type local_158;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  local_138;
  undefined1 local_108 [8];
  Vector closest_point;
  double local_f0;
  double t;
  double do2ptr;
  undefined1 local_c8 [8];
  Vector o2pt;
  double local_b0;
  type local_a8;
  undefined1 local_88 [8];
  Vector r;
  Vector o;
  double l;
  undefined1 local_48 [8];
  Vector dif;
  double *t1_local;
  double *t0_local;
  Vector *b_local;
  Vector *a_local;
  Vector *point_local;
  
  dif.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1] =
       (double)t1;
  Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              *)&l,(MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)b,
             (MatrixBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)a);
  Eigen::Matrix<double,1,2,1,1,2>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::Matrix<double,1,2,1,1,2>const>>
            ((Matrix<double,1,2,1,1,2> *)local_48,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              *)&l);
  local_b0 = squared_norm((Vector<2> *)local_48);
  if (1e-14 <= local_b0) {
    Eigen::Matrix<double,_1,_2,_1,_1,_2>::Matrix
              ((Matrix<double,_1,_2,_1,_1,_2> *)
               (r.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
                array + 1),a);
    local_b0 = 1.0 / local_b0;
    Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator*
              (&local_a8,(MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)local_48,&local_b0);
    Eigen::Matrix<double,1,2,1,1,2>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const>>
              ((Matrix<double,1,2,1,1,2> *)local_88,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                *)&local_a8);
    Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                *)&do2ptr,(MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)point,
               (MatrixBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
               (r.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
                array + 1));
    Eigen::Matrix<double,1,2,1,1,2>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::Matrix<double,1,2,1,1,2>const>>
              ((Matrix<double,1,2,1,1,2> *)local_c8,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                *)&do2ptr);
    t = dot((Vector<2> *)local_c8,(Vector<2> *)local_88);
    if (0.0 <= t) {
      if (t <= 1.0) {
        local_f0 = (*(double *)
                     dif.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                     m_data.array[1] - *t0) * t + *t0;
        Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator*
                  (&local_158,(MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)local_48,&t);
        Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator+
                  (&local_138,
                   (MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)
                   (r.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
                    array + 1),
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                    *)&local_158);
        Eigen::Matrix<double,1,2,1,1,2>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const>const>>
                  ((Matrix<double,1,2,1,1,2> *)local_108,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                    *)&local_138);
        std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::
        pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_true>
                  (__return_storage_ptr__,&local_f0,(Matrix<double,_1,_2,_1,_1,_2> *)local_108);
      }
      else {
        std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::
        pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_true>
                  (__return_storage_ptr__,
                   (double *)
                   dif.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                   .array[1],b);
      }
    }
    else {
      std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::
      pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_true>(__return_storage_ptr__,t0,a);
    }
  }
  else {
    std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::
    pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_true>(__return_storage_ptr__,t0,a);
  }
  return __return_storage_ptr__;
}

Assistant:

static ParameterPoint project_to_line(const Vector& point, const Vector& a, const Vector& b, const double& t0, const double& t1)
    {
        const Vector dif = b - a;
        const double l = squared_norm(dif);

        if (l < 1e-14) {
            return {t0, a};
        }

        const Vector o = a;
        const Vector r = dif * (1.0 / l);
        const Vector o2pt = point - o;
        const double do2ptr = dot(o2pt, r);

        if (do2ptr < 0) {
            return {t0, a};
        }

        if (do2ptr > 1) {
            return {t1, b};
        }

        const double t = t0 + (t1 - t0) * do2ptr;
        const Vector closest_point = o + dif * do2ptr;

        return {t, closest_point};
    }